

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v8::detail::default_arg_formatter<wchar_t>::operator()
          (default_arg_formatter<wchar_t> *this,longdouble value)

{
  basic_format_specs<wchar_t> specs;
  ulong uVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar3;
  undefined2 uStack_17;
  undefined1 uStack_15;
  uint uStack_4;
  
  uStack_4 = CONCAT31(uStack_4._1_3_,1);
  uVar1 = CONCAT44(0x20,(uint)CONCAT12(uStack_15,uStack_17) << 8) & 0xfffffffffffe00ff;
  lVar2 = (ulong)uStack_4 << 0x20;
  specs.type = (char)uVar1;
  specs._9_3_ = (int3)(uVar1 >> 8);
  specs.fill.data_[0] = (int)(uVar1 >> 0x20);
  specs.width = 0;
  specs.precision = -1;
  specs.fill.data_[1] = L'\0';
  specs.fill.data_[2] = L'\0';
  specs.fill.data_[3] = (int)lVar2;
  specs.fill.size_ = (char)((ulong)lVar2 >> 0x20);
  specs.fill._17_3_ = (int3)((ulong)lVar2 >> 0x28);
  bVar3 = write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_long_double,_0>
                    ((this->out).container,value,specs,(locale_ref)0x0);
  return (iterator)bVar3.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }